

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

double __thiscall chaiscript::Boxed_Number::remainder(Boxed_Number *this,double __x,double __y)

{
  Boxed_Value *in_RDX;
  Boxed_Value *in_RSI;
  double extraout_XMM0_Qa;
  Boxed_Number local_30;
  Boxed_Number *t_rhs_local;
  Boxed_Number *t_lhs_local;
  
  t_lhs_local = this;
  oper(&local_30,remainder,in_RSI,in_RDX);
  Boxed_Number(this,&local_30.bv);
  Boxed_Value::~Boxed_Value(&local_30.bv);
  return extraout_XMM0_Qa;
}

Assistant:

static const Boxed_Number remainder(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs) {
      return Boxed_Number(oper(Operators::Opers::remainder, t_lhs.bv, t_rhs.bv));
    }